

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableElement.cpp
# Opt level: O2

void __thiscall
KDReports::TableElementPrivate::createCell
          (TableElementPrivate *this,QTextTable *textTable,ReportBuilder *builder,int row,int column
          ,Cell *cell,QTextCharFormat *charFormat)

{
  int iVar1;
  AlignmentFlag AVar2;
  Alignment alignment;
  VerticalAlignment alignment_00;
  QTextTableCellFormat tableCellFormat;
  QTextCursor cellCursor;
  QFont local_c8 [16];
  QTextTableCell tableCell;
  ReportBuilder cellBuilder;
  
  iVar1 = Cell::columnSpan(cell);
  if (iVar1 < 2) {
    iVar1 = Cell::rowSpan(cell);
    if (iVar1 < 2) goto LAB_0012d81a;
  }
  iVar1 = Cell::rowSpan(cell);
  Cell::columnSpan(cell);
  QTextTable::mergeCells((int)textTable,row,column,iVar1);
LAB_0012d81a:
  QTextTable::cellAt((int)&tableCell,(int)textTable);
  if (_tableCell != 0) {
    QTextTableCell::firstCursorPosition();
    QTextFormat::toTableCellFormat();
    Element::background((Element *)&cellBuilder);
    iVar1 = *(int *)((long)cellBuilder._vptr_ReportBuilder + 4);
    QBrush::~QBrush((QBrush *)&cellBuilder);
    if (iVar1 != 0) {
      Element::background((Element *)&cellBuilder);
      QTextFormat::setBackground((QTextFormat *)&tableCellFormat,(QBrush *)&cellBuilder);
      QBrush::~QBrush((QBrush *)&cellBuilder);
    }
    iVar1 = Cell::columnSpan(cell);
    QTextCharFormat::setTableCellColumnSpan((QTextCharFormat *)&tableCellFormat,iVar1);
    iVar1 = Cell::rowSpan(cell);
    QTextCharFormat::setTableCellRowSpan((QTextCharFormat *)&tableCellFormat,iVar1);
    AVar2 = Cell::verticalAlignment(cell);
    if (AVar2 != 0) {
      alignment.i = Cell::verticalAlignment(cell);
      alignment_00 = ReportBuilder::toVerticalAlignment(alignment);
      QTextCharFormat::setVerticalAlignment((QTextCharFormat *)&tableCellFormat,alignment_00);
    }
    Cell::cellFormatFunction((CellFormatFunc *)&cellBuilder,cell);
    if (cellBuilder._16_8_ != 0) {
      std::function<void_(int,_int,_QTextTableCellFormat_&)>::operator()
                ((function<void_(int,_int,_QTextTableCellFormat_&)> *)&cellBuilder,row,column,
                 &tableCellFormat);
    }
    std::_Function_base::~_Function_base((_Function_base *)&cellBuilder);
    QTextTableCell::setFormat((QTextCharFormat *)&tableCell);
    QTextCursor::setCharFormat((QTextCharFormat *)&cellCursor);
    ReportBuilder::ReportBuilder
              (&cellBuilder,builder->m_contentDocument,&cellCursor,builder->m_report);
    ReportBuilder::copyStateFrom(&cellBuilder,builder);
    QTextCharFormat::font();
    QFont::operator=(&cellBuilder.m_defaultFont,local_c8);
    QFont::~QFont(local_c8);
    Cell::build(cell,&cellBuilder);
    ReportBuilder::~ReportBuilder(&cellBuilder);
    QTextFormat::~QTextFormat((QTextFormat *)&tableCellFormat);
    QTextCursor::~QTextCursor(&cellCursor);
    return;
  }
  qt_assert("tableCell.isValid()",
            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsTableElement.cpp"
            ,0x73);
}

Assistant:

void KDReports::TableElementPrivate::createCell(QTextTable *textTable, ReportBuilder &builder, int row, int column, const Cell &cell, const QTextCharFormat &charFormat) const
{
    if (cell.columnSpan() > 1 || cell.rowSpan() > 1)
        textTable->mergeCells(row, column, cell.rowSpan(), cell.columnSpan());
    QTextTableCell tableCell = textTable->cellAt(row, column);
    Q_ASSERT(tableCell.isValid());
    QTextCursor cellCursor = tableCell.firstCursorPosition();
    QTextTableCellFormat tableCellFormat(charFormat.toTableCellFormat());
    if (cell.background().style() != Qt::NoBrush)
        tableCellFormat.setBackground(cell.background());
    tableCellFormat.setTableCellColumnSpan(cell.columnSpan());
    tableCellFormat.setTableCellRowSpan(cell.rowSpan());
    if (cell.verticalAlignment() != 0)
        tableCellFormat.setVerticalAlignment(ReportBuilder::toVerticalAlignment(cell.verticalAlignment()));
    if (auto func = cell.cellFormatFunction())
        func(row, column, tableCellFormat);
    tableCell.setFormat(tableCellFormat);
    cellCursor.setCharFormat(tableCellFormat);
    ReportBuilder cellBuilder(builder.currentDocumentData(), cellCursor, builder.report());
    cellBuilder.copyStateFrom(builder);
    cellBuilder.setDefaultFont(charFormat.font());
    cell.build(cellBuilder);
}